

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# listener_buffer.c
# Opt level: O0

void ht_listener_buffer_process_serialized_events
               (HT_ListenerBuffer *buffer,TEventPtr events,size_t size,
               HT_ListenerFlushCallback flush_callback,void *listener)

{
  size_t local_48;
  size_t actual_size;
  size_t written;
  void *listener_local;
  HT_ListenerFlushCallback flush_callback_local;
  size_t size_local;
  TEventPtr events_local;
  HT_ListenerBuffer *buffer_local;
  
  actual_size = 0;
  if (buffer->max_size == 0) {
    (*flush_callback)(listener,events,size);
  }
  else {
    while (actual_size < size) {
      if (buffer->max_size - buffer->usage < size - actual_size) {
        local_48 = buffer->max_size - buffer->usage;
      }
      else {
        local_48 = size - actual_size;
      }
      memcpy(buffer->data + buffer->usage,events + actual_size,local_48);
      actual_size = local_48 + actual_size;
      buffer->usage = local_48 + buffer->usage;
      if (buffer->usage == buffer->max_size) {
        ht_listener_buffer_flush(buffer,flush_callback,listener);
      }
    }
  }
  return;
}

Assistant:

void
ht_listener_buffer_process_serialized_events(HT_ListenerBuffer* buffer,
                                             TEventPtr events,
                                             size_t size,
                                             HT_ListenerFlushCallback flush_callback,
                                             void* listener)
{
    size_t written = 0;

    if (HT_IS_BYPASS_MODE(buffer))
    {
        flush_callback(listener, events, size);
        return;
    }

    while (written < size)
    {
        size_t actual_size = HT_MIN(size - written, buffer->max_size - buffer->usage);
        memcpy(buffer->data + buffer->usage, events + written, actual_size);
        written += actual_size;
        buffer->usage+= actual_size;

        if (buffer->usage == buffer->max_size)
        {
            ht_listener_buffer_flush(buffer, flush_callback, listener);
        }
    }
}